

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O0

base_uint<256UL,_void> * __thiscall
jbcoin::SerialIter::getBitString<256,void>
          (base_uint<256UL,_void> *__return_storage_ptr__,SerialIter *this)

{
  uint8_t *puVar1;
  iterator pvVar2;
  int n;
  SerialIter *this_local;
  
  base_uint<256UL,_void>::base_uint(__return_storage_ptr__);
  if (this->remain_ < 0x20) {
    Throw<std::runtime_error,char_const(&)[32]>((char (*) [32])"invalid SerialIter getBitString");
  }
  pvVar2 = base_uint<256UL,_void>::begin(__return_storage_ptr__);
  puVar1 = this->p_;
  *(undefined8 *)pvVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(pvVar2 + 8) = *(undefined8 *)(puVar1 + 8);
  *(undefined8 *)(pvVar2 + 0x10) = *(undefined8 *)(puVar1 + 0x10);
  *(undefined8 *)(pvVar2 + 0x18) = *(undefined8 *)(puVar1 + 0x18);
  this->p_ = this->p_ + 0x20;
  this->used_ = this->used_ + 0x20;
  this->remain_ = this->remain_ - 0x20;
  return __return_storage_ptr__;
}

Assistant:

base_uint<Bits, Tag>
SerialIter::getBitString()
{
    base_uint<Bits, Tag> u;
    auto const n = Bits/8;
    if (remain_ < n)
        Throw<std::runtime_error> (
            "invalid SerialIter getBitString");
    std::memcpy (u.begin(), p_, n);
    p_ += n;
    used_ += n;
    remain_ -= n;
    return u;
}